

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall
lzham::symbol_codec::start_decoding
          (symbol_codec *this,uint8 *pBuf,size_t buf_size,bool eof_flag,
          need_bytes_func_ptr pNeed_bytes_func,void *pPrivate_data)

{
  if (buf_size != 0) {
    this->m_pDecode_buf = pBuf;
    this->m_pDecode_buf_next = pBuf;
    this->m_decode_buf_size = buf_size;
    this->m_pDecode_buf_end = pBuf + buf_size;
    this->m_pDecode_need_bytes_func = pNeed_bytes_func;
    this->m_pDecode_private_data = pPrivate_data;
    this->m_decode_buf_eof = eof_flag;
    this->m_bit_buf = 0;
    this->m_bit_count = 0;
    this->m_total_model_updates = 0;
    this->m_mode = cDecoding;
  }
  return buf_size != 0;
}

Assistant:

bool symbol_codec::start_decoding(const uint8* pBuf, size_t buf_size, bool eof_flag, need_bytes_func_ptr pNeed_bytes_func, void *pPrivate_data)
   {
      if (!buf_size)
      {
         LZHAM_LOG_ERROR(4030);
         return false;
      }

      m_total_model_updates = 0;

      m_pDecode_buf = pBuf;
      m_pDecode_buf_next = pBuf;
      m_decode_buf_size = buf_size;
      m_pDecode_buf_end = pBuf + buf_size;

      m_pDecode_need_bytes_func = pNeed_bytes_func;
      m_pDecode_private_data = pPrivate_data;
      m_decode_buf_eof = eof_flag;

      m_bit_buf = 0;
      m_bit_count = 0;

      m_mode = cDecoding;

      return true;
   }